

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getSamplingComputeShaderCode
          (TextureCubeMapArraySamplingTest *this,samplerType *sampler_type,
          samplingFunction *sampling_function,string *out_compute_shader_code)

{
  ostream *poVar1;
  string local_258 [36];
  uint local_234;
  uint local_230;
  GLuint i_3;
  GLuint i_2;
  GLuint i_1;
  GLuint i;
  stringstream local_218 [8];
  stringstream stream;
  ostream local_208;
  undefined1 local_90 [8];
  string sampling_code;
  GLchar *sampler_type_str;
  attributeDefinition *type_attribute_definitions;
  attributeDefinition *routine_attribute_definitions;
  GLuint n_type_attributes;
  GLuint n_routine_attributes;
  GLuint n_components;
  bool is_shadow_sampler;
  GLchar *interpolation_type;
  GLchar *image_layout_str;
  GLchar *image_type_str;
  GLchar *color_type;
  string *out_compute_shader_code_local;
  samplingFunction *sampling_function_local;
  samplerType *sampler_type_local;
  TextureCubeMapArraySamplingTest *this_local;
  
  image_type_str = (GLchar *)0x0;
  image_layout_str = (GLchar *)0x0;
  interpolation_type = (GLchar *)0x0;
  _n_components = (GLchar *)0x0;
  n_routine_attributes._3_1_ = 0;
  n_type_attributes = 0;
  routine_attribute_definitions._4_4_ = 0;
  routine_attribute_definitions._0_4_ = 0;
  type_attribute_definitions = (attributeDefinition *)0x0;
  sampler_type_str = (GLchar *)0x0;
  sampling_code.field_2._8_8_ = 0;
  color_type = (GLchar *)out_compute_shader_code;
  out_compute_shader_code_local = (string *)sampling_function;
  sampling_function_local = sampler_type;
  sampler_type_local = (samplerType *)this;
  std::__cxx11::string::string((string *)local_90);
  std::__cxx11::stringstream::stringstream(local_218);
  getAttributes(*(samplingFunction *)out_compute_shader_code_local,&type_attribute_definitions,
                (GLuint *)((long)&routine_attribute_definitions + 4));
  getAttributes(*sampling_function_local,(attributeDefinition **)&sampler_type_str,
                (GLuint *)&routine_attribute_definitions);
  getColorType(this,*sampling_function_local,&image_type_str,(GLchar **)&n_components,
               (GLchar **)((long)&sampling_code.field_2 + 8),&image_layout_str,&interpolation_type,
               &n_type_attributes,(bool *)((long)&n_routine_attributes + 3));
  if ((n_routine_attributes._3_1_ & 1) == 0) {
    getSamplingFunctionCall
              (this,*(samplingFunction *)out_compute_shader_code_local,image_type_str,
               n_type_attributes,"cs_",(GLchar *)0x0,"color",(GLchar *)0x0,"sampler",
               (string *)local_90);
  }
  else {
    getShadowSamplingFunctionCall
              (this,*(samplingFunction *)out_compute_shader_code_local,image_type_str,
               n_type_attributes,"cs_",(GLchar *)0x0,"color",(GLchar *)0x0,"sampler",
               (string *)local_90);
  }
  poVar1 = std::operator<<(&local_208,"${VERSION}\n${TEXTURE_CUBE_MAP_ARRAY_REQUIRE}\n\n");
  poVar1 = std::operator<<(poVar1,"precision highp float;\n");
  poVar1 = std::operator<<(poVar1,"/* Sampling compute shader */");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(&local_208,"uniform ");
  poVar1 = std::operator<<(poVar1,"highp ");
  poVar1 = std::operator<<(poVar1,(char *)sampling_code.field_2._8_8_);
  poVar1 = std::operator<<(poVar1,"sampler");
  poVar1 = std::operator<<(poVar1,";");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(&local_208,"layout(");
  poVar1 = std::operator<<(poVar1,interpolation_type);
  poVar1 = std::operator<<(poVar1,") ");
  poVar1 = std::operator<<(poVar1,"uniform ");
  poVar1 = std::operator<<(poVar1,"writeonly ");
  poVar1 = std::operator<<(poVar1,"highp ");
  poVar1 = std::operator<<(poVar1,image_layout_str);
  poVar1 = std::operator<<(poVar1,"image");
  poVar1 = std::operator<<(poVar1,";");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (i_2 = 0; i_2 < routine_attribute_definitions._4_4_; i_2 = i_2 + 1) {
    poVar1 = std::operator<<(&local_208,"layout(std430, binding=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,type_attribute_definitions[i_2].binding);
    poVar1 = std::operator<<(poVar1,") buffer ");
    poVar1 = std::operator<<(poVar1,type_attribute_definitions[i_2].name);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::operator<<(&local_208,"{\n");
    poVar1 = std::operator<<(&local_208,"    ");
    poVar1 = std::operator<<(poVar1,type_attribute_definitions[i_2].type);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,type_attribute_definitions[i_2].name);
    std::operator<<(poVar1,"_data[];\n");
    std::operator<<(&local_208,"};\n");
  }
  for (i_3 = 0; i_3 < (uint)routine_attribute_definitions; i_3 = i_3 + 1) {
    poVar1 = std::operator<<(&local_208,"layout(std430, binding=");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,*(int *)(sampler_type_str + (ulong)i_3 * 0x18 + 0x14));
    poVar1 = std::operator<<(poVar1,") buffer ");
    poVar1 = std::operator<<(poVar1,*(char **)(sampler_type_str + (ulong)i_3 * 0x18));
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::operator<<(&local_208,"{\n");
    poVar1 = std::operator<<(&local_208,"    ");
    poVar1 = std::operator<<(poVar1,*(char **)(sampler_type_str + (ulong)i_3 * 0x18 + 8));
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,*(char **)(sampler_type_str + (ulong)i_3 * 0x18));
    std::operator<<(poVar1,"_data[];\n");
    std::operator<<(&local_208,"};\n");
  }
  poVar1 = std::operator<<(&local_208,
                           "layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(&local_208,
                  "void main()\n{\n    const int face_width         = 3;\n    const int face_height        = 3;\n    const int vertices_per_face  = face_width * face_height;\n    const int faces_per_layer    = 6;\n    const int layer_width        = faces_per_layer * face_width;\n    const int vertices_per_layer = vertices_per_face * faces_per_layer;\n\n    ivec2 image_coord            = ivec2(gl_WorkGroupID.xy);\n    ivec3 texture_size           = textureSize(sampler, 0);\n\n    int layer                    = image_coord.x / layer_width;\n    int layer_offset             = layer * layer_width;\n    int layer_index              = layer * vertices_per_layer;\n    int face                     = (image_coord.x - layer_offset) / face_width;\n    int face_offset              = face * face_width;\n    int face_index               = face * vertices_per_face;\n    int vertex                   = image_coord.x - layer_offset - face_offset;\n    int vertex_index             = layer_index + face_index + vertex + (face_height - image_coord.y - 1) * face_width;\n\n"
                 );
  for (local_230 = 0; local_230 < routine_attribute_definitions._4_4_; local_230 = local_230 + 1) {
    poVar1 = std::operator<<(&local_208,"    ");
    poVar1 = std::operator<<(poVar1,type_attribute_definitions[local_230].type);
    poVar1 = std::operator<<(poVar1,"cs_");
    poVar1 = std::operator<<(poVar1,type_attribute_definitions[local_230].name);
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,type_attribute_definitions[local_230].name);
    poVar1 = std::operator<<(poVar1,"_data[vertex_index];");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  for (local_234 = 0; local_234 < (uint)routine_attribute_definitions; local_234 = local_234 + 1) {
    poVar1 = std::operator<<(&local_208,"    ");
    poVar1 = std::operator<<(poVar1,*(char **)(sampler_type_str + (ulong)local_234 * 0x18 + 8));
    poVar1 = std::operator<<(poVar1,"cs_");
    poVar1 = std::operator<<(poVar1,*(char **)(sampler_type_str + (ulong)local_234 * 0x18));
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = std::operator<<(poVar1,*(char **)(sampler_type_str + (ulong)local_234 * 0x18));
    poVar1 = std::operator<<(poVar1,"_data[vertex_index];");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  poVar1 = (ostream *)std::ostream::operator<<(&local_208,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"    ");
  poVar1 = std::operator<<(poVar1,image_type_str);
  poVar1 = std::operator<<(poVar1,"color");
  poVar1 = std::operator<<(poVar1,";");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(&local_208,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,(string *)local_90);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator<<(&local_208,"    imageStore(image, image_coord, ");
  if (n_type_attributes == 1) {
    if (*sampling_function_local == TextureGather) {
      poVar1 = std::operator<<(&local_208,"vec4(");
      poVar1 = std::operator<<(poVar1,"color");
      std::operator<<(poVar1,")");
    }
    else if (*sampling_function_local == 4) {
      poVar1 = std::operator<<(&local_208,"uvec4(");
      poVar1 = std::operator<<(poVar1,"color");
      std::operator<<(poVar1,")");
    }
  }
  else if (n_type_attributes == 4) {
    std::operator<<(&local_208,"color");
  }
  std::operator<<(&local_208,");\n");
  poVar1 = std::operator<<(&local_208,"}\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)color_type,local_258);
  std::__cxx11::string::~string(local_258);
  std::__cxx11::stringstream::~stringstream(local_218);
  std::__cxx11::string::~string((string *)local_90);
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getSamplingComputeShaderCode(const samplerType&	  sampler_type,
																   const samplingFunction& sampling_function,
																   std::string&			   out_compute_shader_code)
{
	const glw::GLchar*		   color_type					 = 0;
	const glw::GLchar*		   image_type_str				 = 0;
	const glw::GLchar*		   image_layout_str				 = 0;
	const glw::GLchar*		   interpolation_type			 = 0;
	bool					   is_shadow_sampler			 = false;
	glw::GLuint				   n_components					 = 0;
	glw::GLuint				   n_routine_attributes			 = 0;
	glw::GLuint				   n_type_attributes			 = 0;
	const attributeDefinition* routine_attribute_definitions = 0;
	const attributeDefinition* type_attribute_definitions	= 0;
	const glw::GLchar*		   sampler_type_str				 = 0;
	std::string				   sampling_code;
	std::stringstream		   stream;

	/* Get attributes for sampling function */
	getAttributes(sampling_function, routine_attribute_definitions, n_routine_attributes);
	getAttributes(sampler_type, type_attribute_definitions, n_type_attributes);

	/* Get type for color variables */
	getColorType(sampler_type, color_type, interpolation_type, sampler_type_str, image_type_str, image_layout_str,
				 n_components, is_shadow_sampler);

	/* Get sampling code */
	if (false == is_shadow_sampler)
	{
		getSamplingFunctionCall(sampling_function, color_type, n_components, compute_shader_param, 0,
								compute_shader_color, 0, sampler_name, sampling_code);
	}
	else
	{
		getShadowSamplingFunctionCall(sampling_function, color_type, n_components, compute_shader_param, 0,
									  compute_shader_color, 0, sampler_name, sampling_code);
	}

	/* Preamble */
	stream << shader_code_preamble << shader_precision << "/* Sampling compute shader */" << std::endl;

	/* uniform samplerType sampler */
	stream << shader_uniform << "highp " << sampler_type_str << sampler_name << ";" << std::endl;

	/* uniform writeonly image2D image*/
	stream << "layout(" << image_layout_str << ") " << shader_uniform << shader_writeonly << "highp " << image_type_str
		   << image_name << ";" << std::endl;

	/* layout(shared) buffer attribute { type attribute_data[]; }; */
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << compute_shader_layout_binding << routine_attribute_definitions[i].binding << compute_shader_buffer
			   << routine_attribute_definitions[i].name << std::endl;

		stream << "{\n";
		stream << "    " << routine_attribute_definitions[i].type << " " << routine_attribute_definitions[i].name
			   << "_data[];\n";
		stream << "};\n";
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << compute_shader_layout_binding << type_attribute_definitions[i].binding << compute_shader_buffer
			   << type_attribute_definitions[i].name << std::endl;

		stream << "{\n";
		stream << "    " << type_attribute_definitions[i].type << " " << type_attribute_definitions[i].name
			   << "_data[];\n";
		stream << "};\n";
	}

	/* layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in; */
	stream << compute_shader_layout << std::endl;

	/* main + body */
	stream << compute_shader_body;

	/* type cs_attribute = attribute_data[vertex_index] */
	for (glw::GLuint i = 0; i < n_routine_attributes; ++i)
	{
		stream << "    " << routine_attribute_definitions[i].type << compute_shader_param
			   << routine_attribute_definitions[i].name << " = " << routine_attribute_definitions[i].name
			   << "_data[vertex_index];" << std::endl;
	}
	for (glw::GLuint i = 0; i < n_type_attributes; ++i)
	{
		stream << "    " << type_attribute_definitions[i].type << compute_shader_param
			   << type_attribute_definitions[i].name << " = " << type_attribute_definitions[i].name
			   << "_data[vertex_index];" << std::endl;
	}

	/* type color */
	stream << std::endl << "    " << color_type << compute_shader_color << ";" << std::endl;

	/* color = texture*/
	stream << std::endl << sampling_code << std::endl;
	//stream << std::endl << compute_shader_color << " = vec4(cs_grad_x, 255.0);" << std::endl;

	/* imageStore */
	stream << compute_shader_image_store;
	switch (n_components)
	{
	case 1:
		/* imageStore(image, image_coord, color.r);*/
		if (sampler_type == Depth)
		{
			stream << "vec4(" << compute_shader_color << ")";
		}
		else if (sampler_type == Stencil)
		{
			stream << "uvec4(" << compute_shader_color << ")";
		}
		else
		{
			// unexpected case
			DE_ASSERT(false);
		}
		break;
	case 4:
		/* imageStore(image, image_coord, color);*/
		stream << compute_shader_color;
		break;
	};

	stream << ");\n";

	stream << "}\n" << std::endl;

	out_compute_shader_code = stream.str();
}